

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_type_set.cpp
# Opt level: O1

optional_ptr<duckdb::IndexType,_true> __thiscall
duckdb::IndexTypeSet::FindByName(IndexTypeSet *this,string *name)

{
  int iVar1;
  iterator iVar2;
  IndexType *pIVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    iVar2 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::IndexType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::IndexType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->functions)._M_h,name);
    pIVar3 = (IndexType *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::IndexType>,_true>
                    ._M_cur + 0x28);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::IndexType>,_true>
        ._M_cur == (__node_type *)0x0) {
      pIVar3 = (IndexType *)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return (optional_ptr<duckdb::IndexType,_true>)pIVar3;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

optional_ptr<IndexType> IndexTypeSet::FindByName(const string &name) {
	lock_guard<mutex> g(lock);
	auto entry = functions.find(name);
	if (entry == functions.end()) {
		return nullptr;
	}
	return &entry->second;
}